

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndArray(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,SizeType elementCount)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar1;
  
  context->inArray = false;
  if (elementCount < this->minItems_) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0xf])
              (context->error_handler,elementCount,(ulong)this->minItems_);
    context->invalidCode = kValidateErrorMinItems;
    this_00 = GetMinItemsString();
  }
  else {
    if (elementCount <= this->maxItems_) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x10])
              (context->error_handler,elementCount,(ulong)this->maxItems_);
    context->invalidCode = kValidateErrorMaxItems;
    this_00 = GetMaxItemsString();
  }
  pCVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar1;
  return false;
}

Assistant:

bool EndArray(Context& context, SizeType elementCount) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndArray");
        context.inArray = false;

        if (elementCount < minItems_) {
            context.error_handler.TooFewItems(elementCount, minItems_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMinItems);
        }

        if (elementCount > maxItems_) {
            context.error_handler.TooManyItems(elementCount, maxItems_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMaxItems);
        }

        return true;
    }